

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

uint8_vec * __thiscall basist::ktx2_transcoder::find_key(ktx2_transcoder *this,string *key_name)

{
  uint32_t uVar1;
  int iVar2;
  key_value *pkVar3;
  char *__s2;
  long in_RDI;
  uint32_t i;
  uchar *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar4;
  uint local_1c;
  
  local_1c = 0;
  while( true ) {
    uVar4 = local_1c;
    uVar1 = basisu::vector<basist::ktx2_transcoder::key_value>::size
                      ((vector<basist::ktx2_transcoder::key_value> *)(in_RDI + 0x80));
    if (uVar1 <= uVar4) {
      return (uint8_vec *)0x0;
    }
    pkVar3 = basisu::vector<basist::ktx2_transcoder::key_value>::operator[]
                       ((vector<basist::ktx2_transcoder::key_value> *)
                        CONCAT44(uVar4,in_stack_ffffffffffffffd0),(size_t)in_stack_ffffffffffffffc8)
    ;
    in_stack_ffffffffffffffc8 = basisu::vector<unsigned_char>::data(&pkVar3->m_key);
    __s2 = (char *)std::__cxx11::string::c_str();
    iVar2 = strcmp((char *)in_stack_ffffffffffffffc8,__s2);
    if (iVar2 == 0) break;
    local_1c = local_1c + 1;
  }
  pkVar3 = basisu::vector<basist::ktx2_transcoder::key_value>::operator[]
                     ((vector<basist::ktx2_transcoder::key_value> *)
                      CONCAT44(uVar4,in_stack_ffffffffffffffd0),(size_t)in_stack_ffffffffffffffc8);
  return &pkVar3->m_value;
}

Assistant:

const basisu::uint8_vec* ktx2_transcoder::find_key(const std::string& key_name) const
	{
		for (uint32_t i = 0; i < m_key_values.size(); i++)
			if (strcmp((const char *)m_key_values[i].m_key.data(), key_name.c_str()) == 0)
				return &m_key_values[i].m_value;

		return nullptr;
	}